

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_4::Repairer::ConvertLogToTable(Repairer *this,uint64_t log)

{
  Logger *pLVar1;
  undefined8 uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  MemTable *this_00;
  size_t sVar6;
  undefined8 uVar7;
  uint64_t in_RDX;
  string local_208;
  Status local_1e8;
  Iterator *local_1e0;
  Iterator *iter;
  FileMetaData meta;
  string local_178;
  Status local_158;
  Slice local_150;
  Slice local_140;
  Status local_130;
  uint local_124;
  MemTable *pMStack_120;
  int counter;
  MemTable *mem;
  WriteBatch batch;
  Slice record;
  string scratch;
  Reader reader;
  LogReporter reporter;
  SequentialFile *local_48;
  SequentialFile *lfile;
  string logname;
  uint64_t log_local;
  Repairer *this_local;
  Status *status;
  
  logname.field_2._8_8_ = in_RDX;
  LogFileName((string *)&lfile,(string *)log,in_RDX);
  (**(code **)(**(long **)(log + 0x20) + 0x10))(this,*(long **)(log + 0x20),&lfile,&local_48);
  bVar4 = Status::ok((Status *)this);
  if (bVar4) {
    ConvertLogToTable::LogReporter::LogReporter((LogReporter *)&reader.resyncing_);
    leveldb::log::Reader::Reader
              ((Reader *)((long)&scratch.field_2 + 8),local_48,(Reporter *)&reader.resyncing_,false,
               0);
    std::__cxx11::string::string((string *)&record.size_);
    Slice::Slice((Slice *)((long)&batch.rep_.field_2 + 8));
    WriteBatch::WriteBatch((WriteBatch *)&mem);
    this_00 = (MemTable *)operator_new(0x70);
    MemTable::MemTable(this_00,(InternalKeyComparator *)(log + 0x28));
    pMStack_120 = this_00;
    MemTable::Ref(this_00);
    local_124 = 0;
    while (bVar4 = leveldb::log::Reader::ReadRecord
                             ((Reader *)((long)&scratch.field_2 + 8),
                              (Slice *)((long)&batch.rep_.field_2 + 8),(string *)&record.size_),
          bVar4) {
      sVar6 = Slice::size((Slice *)((long)&batch.rep_.field_2 + 8));
      if (sVar6 < 0xc) {
        sVar6 = Slice::size((Slice *)((long)&batch.rep_.field_2 + 8));
        Slice::Slice(&local_140,"log record too small");
        Slice::Slice(&local_150);
        Status::Corruption(&local_130,&local_140,&local_150);
        (anonymous_namespace)::Repairer::ConvertLogToTable(unsigned_long)::LogReporter::
        Corruption(unsigned_long,leveldb::Status_const__(&reader.resyncing_,sVar6,&local_130);
        Status::~Status(&local_130);
      }
      else {
        WriteBatchInternal::SetContents((WriteBatch *)&mem,(Slice *)((long)&batch.rep_.field_2 + 8))
        ;
        WriteBatchInternal::InsertInto
                  ((WriteBatchInternal *)&local_158,(WriteBatch *)&mem,pMStack_120);
        Status::operator=((Status *)this,&local_158);
        Status::~Status(&local_158);
        bVar4 = Status::ok((Status *)this);
        uVar2 = logname.field_2._8_8_;
        if (bVar4) {
          iVar5 = WriteBatchInternal::Count((WriteBatch *)&mem);
          local_124 = iVar5 + local_124;
        }
        else {
          pLVar1 = *(Logger **)(log + 0x60);
          Status::ToString_abi_cxx11_(&local_178,(Status *)this);
          uVar7 = std::__cxx11::string::c_str();
          Log(pLVar1,"Log #%llu: ignoring %s",uVar2,uVar7);
          std::__cxx11::string::~string((string *)&local_178);
          Status::OK();
          Status::operator=((Status *)this,(Status *)((long)&meta.largest.rep_.field_2 + 8));
          Status::~Status((Status *)((long)&meta.largest.rep_.field_2 + 8));
        }
      }
    }
    if (local_48 != (SequentialFile *)0x0) {
      (*local_48->_vptr_SequentialFile[1])();
    }
    FileMetaData::FileMetaData((FileMetaData *)&iter);
    meta._0_8_ = *(long *)(log + 0x1c0);
    *(long *)(log + 0x1c0) = meta._0_8_ + 1;
    local_1e0 = MemTable::NewIterator(pMStack_120);
    BuildTable((leveldb *)&local_1e8,(string *)log,*(Env **)(log + 0x20),(Options *)(log + 0x48),
               *(TableCache **)(log + 0xb0),local_1e0,(FileMetaData *)&iter);
    Status::operator=((Status *)this,&local_1e8);
    Status::~Status(&local_1e8);
    if (local_1e0 != (Iterator *)0x0) {
      (*local_1e0->_vptr_Iterator[1])();
    }
    MemTable::Unref(pMStack_120);
    pMStack_120 = (MemTable *)0x0;
    bVar4 = Status::ok((Status *)this);
    if ((bVar4) && (meta.number != 0)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(log + 0x178),
                 (value_type_conflict *)&meta);
    }
    uVar3 = local_124;
    uVar2 = meta._0_8_;
    pLVar1 = *(Logger **)(log + 0x60);
    Status::ToString_abi_cxx11_(&local_208,(Status *)this);
    uVar7 = std::__cxx11::string::c_str();
    Log(pLVar1,"Log #%llu: %d ops saved to Table #%llu %s",logname.field_2._8_8_,(ulong)uVar3,uVar2,
        uVar7);
    std::__cxx11::string::~string((string *)&local_208);
    FileMetaData::~FileMetaData((FileMetaData *)&iter);
    WriteBatch::~WriteBatch((WriteBatch *)&mem);
    std::__cxx11::string::~string((string *)&record.size_);
    leveldb::log::Reader::~Reader((Reader *)((long)&scratch.field_2 + 8));
    ConvertLogToTable::LogReporter::~LogReporter((LogReporter *)&reader.resyncing_);
  }
  std::__cxx11::string::~string((string *)&lfile);
  return (Status)(char *)this;
}

Assistant:

Status ConvertLogToTable(uint64_t log) {
    struct LogReporter : public log::Reader::Reporter {
      Env* env;
      Logger* info_log;
      uint64_t lognum;
      void Corruption(size_t bytes, const Status& s) override {
        // We print error messages for corruption, but continue repairing.
        Log(info_log, "Log #%llu: dropping %d bytes; %s",
            (unsigned long long)lognum, static_cast<int>(bytes),
            s.ToString().c_str());
      }
    };

    // Open the log file
    std::string logname = LogFileName(dbname_, log);
    SequentialFile* lfile;
    Status status = env_->NewSequentialFile(logname, &lfile);
    if (!status.ok()) {
      return status;
    }

    // Create the log reader.
    LogReporter reporter;
    reporter.env = env_;
    reporter.info_log = options_.info_log;
    reporter.lognum = log;
    // We intentionally make log::Reader do checksumming so that
    // corruptions cause entire commits to be skipped instead of
    // propagating bad information (like overly large sequence
    // numbers).
    log::Reader reader(lfile, &reporter, false /*do not checksum*/,
                       0 /*initial_offset*/);

    // Read all the records and add to a memtable
    std::string scratch;
    Slice record;
    WriteBatch batch;
    MemTable* mem = new MemTable(icmp_);
    mem->Ref();
    int counter = 0;
    while (reader.ReadRecord(&record, &scratch)) {
      if (record.size() < 12) {
        reporter.Corruption(record.size(),
                            Status::Corruption("log record too small"));
        continue;
      }
      WriteBatchInternal::SetContents(&batch, record);
      status = WriteBatchInternal::InsertInto(&batch, mem);
      if (status.ok()) {
        counter += WriteBatchInternal::Count(&batch);
      } else {
        Log(options_.info_log, "Log #%llu: ignoring %s",
            (unsigned long long)log, status.ToString().c_str());
        status = Status::OK();  // Keep going with rest of file
      }
    }
    delete lfile;

    // Do not record a version edit for this conversion to a Table
    // since ExtractMetaData() will also generate edits.
    FileMetaData meta;
    meta.number = next_file_number_++;
    Iterator* iter = mem->NewIterator();
    status = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    delete iter;
    mem->Unref();
    mem = nullptr;
    if (status.ok()) {
      if (meta.file_size > 0) {
        table_numbers_.push_back(meta.number);
      }
    }
    Log(options_.info_log, "Log #%llu: %d ops saved to Table #%llu %s",
        (unsigned long long)log, counter, (unsigned long long)meta.number,
        status.ToString().c_str());
    return status;
  }